

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O0

void __thiscall
amrex::PODVector<double,_std::allocator<double>_>::PODVector
          (PODVector<double,_std::allocator<double>_> *this,size_type a_size,
          value_type_conflict1 *a_value,allocator_type *a_allocator)

{
  allocator<double> *in_RCX;
  unsigned_long in_RDX;
  double *in_RSI;
  allocator<double> *in_RDI;
  
  std::allocator<double>::allocator(in_RCX,in_RDI);
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  GetNewCapacity((PODVector<double,_std::allocator<double>_> *)a_value,(size_type)a_allocator);
  AllocateBuffer((PODVector<double,_std::allocator<double>_> *)a_value,(size_type)a_allocator);
  *(double **)(in_RDI + 8) = in_RSI;
  detail::uninitializedFillNImpl<std::allocator<double>,double,unsigned_long,double>
            (in_RSI,in_RDX,(double *)in_RCX,in_RDI);
  return;
}

Assistant:

PODVector (size_type a_size, const value_type& a_value,
                   const allocator_type& a_allocator = Allocator()) noexcept
            : Allocator(a_allocator), m_data(nullptr), m_size(0), m_capacity(0)
        {
            AllocateBuffer(GetNewCapacity(a_size));
            m_size = a_size;
            detail::uninitializedFillNImpl<Allocator>(m_data, a_size, a_value, *this);
        }